

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraCodeBlocksGenerator::CreateNewProjectFile
          (cmExtraCodeBlocksGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  cmMakefile *mf;
  cmGlobalGenerator *pcVar1;
  cmMakefile *pcVar2;
  pointer ppcVar3;
  cmLocalGenerator *pcVar4;
  pointer ppcVar5;
  cmGeneratorTarget *pcVar6;
  cmake *pcVar7;
  cmSourceFile *this_00;
  cmMakefile *this_01;
  pointer pbVar8;
  _Base_ptr p_Var9;
  pointer pbVar10;
  pointer ppcVar11;
  bool bVar12;
  __type _Var13;
  bool bVar14;
  TargetType TVar15;
  string *psVar16;
  long lVar17;
  _Rb_tree_node_base *p_Var18;
  string *psVar19;
  string *psVar20;
  string *__rhs;
  pointer ppcVar21;
  mapped_type *pmVar22;
  iterator iVar23;
  mapped_type *this_02;
  _Base_ptr p_Var24;
  pointer ppcVar25;
  _Base_ptr p_Var26;
  pointer filename_00;
  cmGeneratorTarget *gt;
  pointer ppcVar27;
  pointer pbVar28;
  all_files_map_t allFiles;
  allocator<char> local_459;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  listFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  splitted;
  cmXMLWriter xml;
  cmGeneratorTarget *target;
  string compiler;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cFiles;
  string local_300;
  Tree tree;
  cmGeneratedFileStream fout;
  
  mf = (*(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
         super__Vector_impl_data._M_start)->Makefile;
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,filename,false,None);
  if (((&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    tree.path._M_dataplus._M_p = (pointer)&tree.path.field_2;
    tree.path._M_string_length = 0;
    tree.path.field_2._M_local_buf[0] = '\0';
    tree.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    tree.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    tree.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    tree.files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &tree.files._M_t._M_impl.super__Rb_tree_header._M_header;
    tree.files._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    tree.files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    tree.files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    tree.files._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         tree.files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var18 = (pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var18 != &(pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header;
        p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18)) {
      listFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      listFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      listFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      p_Var26 = p_Var18[2]._M_parent;
      for (p_Var24 = *(_Base_ptr *)(p_Var18 + 2);
          pbVar10 = listFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
          psVar19 = listFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, p_Var24 != p_Var26;
          p_Var24 = (_Base_ptr)&p_Var24->_M_parent) {
        cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&listFiles,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(*(long *)(*(long *)p_Var24 + 0x28) + 0x1d0));
      }
      for (; psVar19 != pbVar10; psVar19 = psVar19 + 1) {
        psVar16 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
        lVar17 = std::__cxx11::string::find((string *)psVar19,(ulong)psVar16);
        if (lVar17 != 0) {
          psVar16 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_
                              ((cmLocalGenerator *)**(undefined8 **)(p_Var18 + 2));
          cmSystemTools::RelativePath((string *)&xml,psVar16,psVar19);
          splitted.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          splitted.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          splitted.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmsys::SystemTools::SplitPath((string *)&xml,&splitted,false);
          std::__cxx11::string::string
                    ((string *)&allFiles,
                     (string *)
                     (splitted.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::erase(&splitted,
                  splitted.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1,
                  (const_iterator)
                  splitted.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
          pcVar2 = *(cmMakefile **)(**(long **)(p_Var18 + 2) + 0x28);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&compiler,"CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES",
                     (allocator<char> *)&local_300);
          psVar16 = cmMakefile::GetSafeDefinition(pcVar2,&compiler);
          bVar12 = cmSystemTools::IsOn(psVar16);
          std::__cxx11::string::~string((string *)&compiler);
          if ((splitted.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               splitted.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) &&
             (((!bVar12 ||
               (lVar17 = std::__cxx11::string::find((char *)&xml,0x46f9dc), lVar17 == -1)) &&
              (lVar17 = std::__cxx11::string::find((char *)&xml,0x444549), lVar17 == -1)))) {
            Tree::InsertPath(&tree,&splitted,1,(string *)&allFiles);
          }
          std::__cxx11::string::~string((string *)&allFiles);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&splitted);
          std::__cxx11::string::~string((string *)&xml);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&listFiles);
    }
    GetCBCompilerId_abi_cxx11_(&compiler,this,mf);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&xml,"CMAKE_MAKE_PROGRAM",(allocator<char> *)&allFiles);
    psVar19 = cmMakefile::GetRequiredDefinition(mf,(string *)&xml);
    std::__cxx11::string::~string((string *)&xml);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&xml,"CMAKE_CODEBLOCKS_MAKE_ARGUMENTS",(allocator<char> *)&allFiles);
    psVar16 = cmMakefile::GetSafeDefinition(mf,(string *)&xml);
    std::__cxx11::string::~string((string *)&xml);
    cmXMLWriter::cmXMLWriter(&xml,(ostream *)&fout,0);
    cmXMLWriter::StartDocument(&xml,"UTF-8");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&allFiles,"CodeBlocks_project_file",(allocator<char> *)&listFiles);
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&allFiles,"FileVersion",(allocator<char> *)&listFiles);
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    allFiles._M_t._M_impl._0_4_ = 1;
    cmXMLWriter::Attribute<int>(&xml,"major",(int *)&allFiles);
    allFiles._M_t._M_impl._0_4_ = 6;
    cmXMLWriter::Attribute<int>(&xml,"minor",(int *)&allFiles);
    cmXMLWriter::EndElement(&xml);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&allFiles,"Project",(allocator<char> *)&listFiles);
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&allFiles,"Option",(allocator<char> *)&listFiles);
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    cmLocalGenerator::GetProjectName_abi_cxx11_
              ((string *)&allFiles,
               *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                _M_impl.super__Vector_impl_data._M_start);
    cmXMLWriter::Attribute<std::__cxx11::string>
              (&xml,"title",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    cmXMLWriter::EndElement(&xml);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&allFiles,"Option",(allocator<char> *)&listFiles);
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    allFiles._M_t._M_impl._0_4_ = 1;
    cmXMLWriter::Attribute<int>(&xml,"makefile_is_custom",(int *)&allFiles);
    cmXMLWriter::EndElement(&xml);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&allFiles,"Option",(allocator<char> *)&listFiles);
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    cmXMLWriter::Attribute<std::__cxx11::string>(&xml,"compiler",&compiler);
    cmXMLWriter::EndElement(&xml);
    Tree::BuildVirtualFolder(&tree,&xml);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&allFiles,"Build",(allocator<char> *)&listFiles);
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&allFiles,"all",(allocator<char> *)&listFiles);
    AppendTarget(this,&xml,(string *)&allFiles,(cmGeneratorTarget *)0x0,psVar19,
                 *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start,&compiler,psVar16);
    std::__cxx11::string::~string((string *)&allFiles);
    ppcVar3 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar21 = (lgs->
                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                    _M_impl.super__Vector_impl_data._M_start; ppcVar21 != ppcVar3;
        ppcVar21 = ppcVar21 + 1) {
      pcVar4 = *ppcVar21;
      ppcVar5 = (pcVar4->GeneratorTargets).
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar25 = (pcVar4->GeneratorTargets).
                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppcVar25 != ppcVar5;
          ppcVar25 = ppcVar25 + 1) {
        pcVar6 = *ppcVar25;
        psVar20 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar6);
        std::__cxx11::string::string((string *)&allFiles,(string *)psVar20);
        TVar15 = cmGeneratorTarget::GetType(pcVar6);
        if (TVar15 < UTILITY) {
          AppendTarget(this,&xml,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &allFiles,pcVar6,psVar19,pcVar4,&compiler,psVar16);
          std::__cxx11::string::string((string *)&listFiles,(string *)&allFiles);
          std::__cxx11::string::append((char *)&listFiles);
          AppendTarget(this,&xml,(string *)&listFiles,pcVar6,psVar19,pcVar4,&compiler,psVar16);
          std::__cxx11::string::~string((string *)&listFiles);
        }
        else if (TVar15 == UTILITY) {
          lVar17 = std::__cxx11::string::find((char *)&allFiles,0x4659da);
          if ((((lVar17 != 0) ||
               (bVar12 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&allFiles,"Nightly"), !bVar12)) &&
              ((lVar17 = std::__cxx11::string::find((char *)&allFiles,0x4659e2), lVar17 != 0 ||
               (bVar12 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&allFiles,"Continuous"), !bVar12)))) &&
             ((lVar17 = std::__cxx11::string::find((char *)&allFiles,0x4659ed), lVar17 != 0 ||
              (bVar12 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&allFiles,"Experimental"), !bVar12)))) {
LAB_002533b0:
            AppendTarget(this,&xml,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &allFiles,(cmGeneratorTarget *)0x0,psVar19,pcVar4,&compiler,psVar16);
          }
        }
        else if (TVar15 == GLOBAL_TARGET) {
          psVar20 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar4);
          __rhs = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(pcVar4);
          _Var13 = std::operator==(psVar20,__rhs);
          if (_Var13) goto LAB_002533b0;
        }
        std::__cxx11::string::~string((string *)&allFiles);
      }
    }
    cmXMLWriter::EndElement(&xml);
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &allFiles._M_t._M_impl.super__Rb_tree_header._M_header;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    cFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar7 = ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->CMakeInstance;
    ppcVar3 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (ppcVar21 = (lgs->
                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        pbVar10 = cFiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish, ppcVar21 != ppcVar3;
        ppcVar21 = ppcVar21 + 1) {
      pcVar4 = *ppcVar21;
      pcVar2 = pcVar4->Makefile;
      ppcVar5 = (pcVar4->GeneratorTargets).
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar25 = (pcVar4->GeneratorTargets).
                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppcVar25 != ppcVar5;
          ppcVar25 = ppcVar25 + 1) {
        target = *ppcVar25;
        TVar15 = cmGeneratorTarget::GetType(target);
        pcVar6 = target;
        if (TVar15 < GLOBAL_TARGET) {
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&listFiles,"CMAKE_BUILD_TYPE",(allocator<char> *)&splitted);
          psVar19 = cmMakefile::GetSafeDefinition(pcVar2,(string *)&listFiles);
          cmGeneratorTarget::GetSourceFiles(pcVar6,&sources,psVar19);
          std::__cxx11::string::~string((string *)&listFiles);
          ppcVar11 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          for (ppcVar27 = sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start; ppcVar27 != ppcVar11;
              ppcVar27 = ppcVar27 + 1) {
            this_00 = *ppcVar27;
            TVar15 = cmGeneratorTarget::GetType(pcVar6);
            if ((TVar15 != UTILITY) || (this_00->IsGenerated == false)) {
              cmSourceFile::GetLanguage_abi_cxx11_((string *)&listFiles,this_00);
              bVar12 = std::operator==((string *)&listFiles,"C");
              if ((bVar12) ||
                 ((bVar12 = std::operator==((string *)&listFiles,"CXX"), bVar12 ||
                  (bVar12 = std::operator==((string *)&listFiles,"CUDA"), bVar12)))) {
                psVar19 = cmSourceFile::GetExtension_abi_cxx11_(this_00);
                bVar12 = cmake::IsSourceExtension(pcVar7,psVar19);
              }
              else {
                bVar12 = false;
              }
              psVar19 = cmSourceFile::GetFullPath(this_00,(string *)0x0);
              psVar16 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(pcVar4);
              cmSystemTools::RelativePath((string *)&splitted,psVar16,psVar19);
              this_01 = pcVar4->Makefile;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_300,"CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES",&local_459);
              psVar16 = cmMakefile::GetSafeDefinition(this_01,&local_300);
              bVar14 = cmSystemTools::IsOn(psVar16);
              std::__cxx11::string::~string((string *)&local_300);
              if ((!bVar14) ||
                 (lVar17 = std::__cxx11::string::find((char *)&splitted,0x46f9dc), lVar17 == -1)) {
                if (bVar12 != false) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&cFiles,psVar19);
                }
                pmVar22 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                          ::operator[](&allFiles,psVar19);
                std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
                push_back(&pmVar22->Targets,&target);
              }
              std::__cxx11::string::~string((string *)&splitted);
              std::__cxx11::string::~string((string *)&listFiles);
            }
          }
          std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
                    (&sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
        }
      }
    }
    pcVar7 = ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->CMakeInstance;
    for (filename_00 = cFiles.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; filename_00 != pbVar10;
        filename_00 = filename_00 + 1) {
      cmsys::SystemTools::GetFilenamePath((string *)&listFiles,filename_00);
      std::__cxx11::string::append((char *)&listFiles);
      cmsys::SystemTools::GetFilenameWithoutExtension((string *)&splitted,filename_00);
      std::__cxx11::string::append((string *)&listFiles);
      std::__cxx11::string::~string((string *)&splitted);
      pbVar8 = (pcVar7->HeaderFileExtensions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar28 = (pcVar7->HeaderFileExtensions).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar28 != pbVar8;
          pbVar28 = pbVar28 + 1) {
        std::__cxx11::string::string((string *)&splitted,(string *)&listFiles);
        std::__cxx11::string::append((char *)&splitted);
        std::__cxx11::string::append((string *)&splitted);
        iVar23 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                 ::find(&allFiles._M_t,(string *)&splitted);
        if ((_Rb_tree_header *)iVar23._M_node != &allFiles._M_t._M_impl.super__Rb_tree_header) {
LAB_00253821:
          std::__cxx11::string::~string((string *)&splitted);
          break;
        }
        bVar12 = cmsys::SystemTools::FileExists((string *)&splitted);
        if (bVar12) {
          pmVar22 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                  *)&allFiles._M_t,filename_00);
          this_02 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                  *)&allFiles._M_t,(string *)&splitted);
          std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
          operator=(&this_02->Targets,&pmVar22->Targets);
          goto LAB_00253821;
        }
        std::__cxx11::string::~string((string *)&splitted);
      }
      std::__cxx11::string::~string((string *)&listFiles);
    }
    for (p_Var24 = allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var24 != &allFiles._M_t._M_impl.super__Rb_tree_header;
        p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&listFiles,"Unit",(allocator<char> *)&splitted);
      cmXMLWriter::StartElement(&xml,(string *)&listFiles);
      std::__cxx11::string::~string((string *)&listFiles);
      cmXMLWriter::Attribute<std::__cxx11::string>
                (&xml,"filename",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var24 + 1))
      ;
      p_Var9 = p_Var24[2]._M_parent;
      for (p_Var26 = *(_Base_ptr *)(p_Var24 + 2); p_Var26 != p_Var9;
          p_Var26 = (_Base_ptr)&p_Var26->_M_parent) {
        pcVar6 = *(cmGeneratorTarget **)p_Var26;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&listFiles,"Option",(allocator<char> *)&splitted);
        cmXMLWriter::StartElement(&xml,(string *)&listFiles);
        std::__cxx11::string::~string((string *)&listFiles);
        psVar19 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar6);
        cmXMLWriter::Attribute<std::__cxx11::string>(&xml,"target",psVar19);
        cmXMLWriter::EndElement(&xml);
      }
      cmXMLWriter::EndElement(&xml);
    }
    psVar19 = cmMakefile::GetHomeDirectory_abi_cxx11_(mf);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&listFiles,
                   psVar19,"/");
    Tree::BuildUnit(&tree,&xml,(string *)&listFiles);
    std::__cxx11::string::~string((string *)&listFiles);
    cmXMLWriter::EndElement(&xml);
    cmXMLWriter::EndElement(&xml);
    cmXMLWriter::EndDocument(&xml);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cFiles);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
    ::~_Rb_tree(&allFiles._M_t);
    cmXMLWriter::~cmXMLWriter(&xml);
    std::__cxx11::string::~string((string *)&compiler);
    Tree::~Tree(&tree);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::CreateNewProjectFile(
  const std::vector<cmLocalGenerator*>& lgs, const std::string& filename)
{
  const cmMakefile* mf = lgs[0]->GetMakefile();
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  Tree tree;

  // build tree of virtual folders
  for (auto const& it : this->GlobalGenerator->GetProjectMap()) {
    // Collect all files
    std::vector<std::string> listFiles;
    for (cmLocalGenerator* lg : it.second) {
      cmAppend(listFiles, lg->GetMakefile()->GetListFiles());
    }

    // Convert
    for (std::string const& listFile : listFiles) {
      // don't put cmake's own files into the project (#12110):
      if (listFile.find(cmSystemTools::GetCMakeRoot()) == 0) {
        continue;
      }

      const std::string& relative = cmSystemTools::RelativePath(
        it.second[0]->GetSourceDirectory(), listFile);
      std::vector<std::string> splitted;
      cmSystemTools::SplitPath(relative, splitted, false);
      // Split filename from path
      std::string fileName = *(splitted.end() - 1);
      splitted.erase(splitted.end() - 1, splitted.end());

      // We don't want paths with CMakeFiles in them
      // or do we?
      // In speedcrunch those where purely internal
      //
      // Also we can disable external (outside the project) files by setting ON
      // CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES variable.
      const bool excludeExternal =
        cmSystemTools::IsOn(it.second[0]->GetMakefile()->GetSafeDefinition(
          "CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES"));
      if (!splitted.empty() &&
          (!excludeExternal || (relative.find("..") == std::string::npos)) &&
          relative.find("CMakeFiles") == std::string::npos) {
        tree.InsertPath(splitted, 1, fileName);
      }
    }
  }

  // figure out the compiler
  std::string compiler = this->GetCBCompilerId(mf);
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string& makeArgs =
    mf->GetSafeDefinition("CMAKE_CODEBLOCKS_MAKE_ARGUMENTS");

  cmXMLWriter xml(fout);
  xml.StartDocument();
  xml.StartElement("CodeBlocks_project_file");

  xml.StartElement("FileVersion");
  xml.Attribute("major", 1);
  xml.Attribute("minor", 6);
  xml.EndElement();

  xml.StartElement("Project");

  xml.StartElement("Option");
  xml.Attribute("title", lgs[0]->GetProjectName());
  xml.EndElement();

  xml.StartElement("Option");
  xml.Attribute("makefile_is_custom", 1);
  xml.EndElement();

  xml.StartElement("Option");
  xml.Attribute("compiler", compiler);
  xml.EndElement();

  // Now build a virtual tree
  tree.BuildVirtualFolder(xml);

  xml.StartElement("Build");

  this->AppendTarget(xml, "all", nullptr, make, lgs[0], compiler, makeArgs);

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (cmLocalGenerator* lg : lgs) {
    const std::vector<cmGeneratorTarget*>& targets = lg->GetGeneratorTargets();
    for (cmGeneratorTarget* target : targets) {
      std::string targetName = target->GetName();
      switch (target->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (lg->GetCurrentBinaryDirectory() == lg->GetBinaryDirectory()) {
            this->AppendTarget(xml, targetName, nullptr, make, lg, compiler,
                               makeArgs);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((targetName.find("Nightly") == 0) &&
               (targetName != "Nightly")) ||
              ((targetName.find("Continuous") == 0) &&
               (targetName != "Continuous")) ||
              ((targetName.find("Experimental") == 0) &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(xml, targetName, nullptr, make, lg, compiler,
                             makeArgs);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          cmGeneratorTarget* gt = target;
          this->AppendTarget(xml, targetName, gt, make, lg, compiler,
                             makeArgs);
          std::string fastTarget = targetName;
          fastTarget += "/fast";
          this->AppendTarget(xml, fastTarget, gt, make, lg, compiler,
                             makeArgs);
        } break;
        default:
          break;
      }
    }
  }

  xml.EndElement(); // Build

  // Collect all used source files in the project.
  // Keep a list of C/C++ source files which might have an accompanying header
  // that should be looked for.
  typedef std::map<std::string, CbpUnit> all_files_map_t;
  all_files_map_t allFiles;
  std::vector<std::string> cFiles;

  auto cm = this->GlobalGenerator->GetCMakeInstance();

  for (cmLocalGenerator* lg : lgs) {
    cmMakefile* makefile = lg->GetMakefile();
    const std::vector<cmGeneratorTarget*>& targets = lg->GetGeneratorTargets();
    for (cmGeneratorTarget* target : targets) {
      switch (target->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY:
        case cmStateEnums::UTILITY: // can have sources since 2.6.3
        {
          std::vector<cmSourceFile*> sources;
          cmGeneratorTarget* gt = target;
          gt->GetSourceFiles(sources,
                             makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (cmSourceFile* s : sources) {
            // don't add source files from UTILITY target which have the
            // GENERATED property set:
            if (gt->GetType() == cmStateEnums::UTILITY &&
                s->GetIsGenerated()) {
              continue;
            }

            // check whether it is a C/C++/CUDA implementation file
            bool isCFile = false;
            std::string lang = s->GetLanguage();
            if (lang == "C" || lang == "CXX" || lang == "CUDA") {
              std::string const& srcext = s->GetExtension();
              isCFile = cm->IsSourceExtension(srcext);
            }

            std::string const& fullPath = s->GetFullPath();

            // Check file position relative to project root dir.
            const std::string relative =
              cmSystemTools::RelativePath(lg->GetSourceDirectory(), fullPath);
            // Do not add this file if it has ".." in relative path and
            // if CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES variable is on.
            const bool excludeExternal =
              cmSystemTools::IsOn(lg->GetMakefile()->GetSafeDefinition(
                "CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES"));
            if (excludeExternal &&
                (relative.find("..") != std::string::npos)) {
              continue;
            }

            if (isCFile) {
              cFiles.push_back(fullPath);
            }

            CbpUnit& cbpUnit = allFiles[fullPath];
            cbpUnit.Targets.push_back(target);
          }
        }
        default: // intended fallthrough
          break;
      }
    }
  }

  std::vector<std::string> const& headerExts =
    this->GlobalGenerator->GetCMakeInstance()->GetHeaderExtensions();

  // The following loop tries to add header files matching to implementation
  // files to the project. It does that by iterating over all
  // C/C++ source files,
  // replacing the file name extension with ".h" and checks whether such a
  // file exists. If it does, it is inserted into the map of files.
  // A very similar version of that code exists also in the CodeLite
  // project generator.
  for (std::string const& fileName : cFiles) {
    std::string headerBasename = cmSystemTools::GetFilenamePath(fileName);
    headerBasename += "/";
    headerBasename += cmSystemTools::GetFilenameWithoutExtension(fileName);

    // check if there's a matching header around
    for (std::string const& ext : headerExts) {
      std::string hname = headerBasename;
      hname += ".";
      hname += ext;
      // if it's already in the set, don't check if it exists on disk
      if (allFiles.find(hname) != allFiles.end()) {
        break;
      }

      if (cmSystemTools::FileExists(hname)) {
        allFiles[hname].Targets = allFiles[fileName].Targets;
        break;
      }
    }
  }

  // insert all source files in the CodeBlocks project
  for (auto const& s : allFiles) {
    std::string const& unitFilename = s.first;
    CbpUnit const& unit = s.second;

    xml.StartElement("Unit");
    xml.Attribute("filename", unitFilename);

    for (cmGeneratorTarget const* tgt : unit.Targets) {
      xml.StartElement("Option");
      xml.Attribute("target", tgt->GetName());
      xml.EndElement();
    }

    xml.EndElement();
  }

  // Add CMakeLists.txt
  tree.BuildUnit(xml, mf->GetHomeDirectory() + "/");

  xml.EndElement(); // Project
  xml.EndElement(); // CodeBlocks_project_file
  xml.EndDocument();
}